

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldAccessor::RemoveLast(MapFieldAccessor *this,Field *data)

{
  RepeatedFieldType *this_00;
  Field *data_local;
  MapFieldAccessor *this_local;
  
  this_00 = MutableRepeatedField(data);
  RepeatedPtrField<google::protobuf::Message>::RemoveLast(this_00);
  return;
}

Assistant:

void RemoveLast(Field* data) const override {
    MutableRepeatedField(data)->RemoveLast();
  }